

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O3

void __thiscall
CGL::GLScene::Scene::Scene
          (Scene *this,
          vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *objects
          ,vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *lights)

{
  (this->lights).
  super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).
  super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectionInfo).info.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectionInfo).info.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lights).
  super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectionInfo).info.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::operator=
            (&this->objects,objects);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::operator=
            (&this->lights,lights);
  this->selectionIdx = -1;
  this->hoverIdx = -1;
  return;
}

Assistant:

Scene(std::vector<SceneObject *> objects, std::vector<SceneLight *> lights) {
    this->objects = objects;
    this->lights = lights;
    this->selectionIdx = -1;
    this->hoverIdx = -1;
  }